

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

ngx_str_node_t * ngx_str_rbtree_lookup(ngx_rbtree_t *rbtree,ngx_str_t *val,uint32_t hash)

{
  ngx_str_node_t *pnVar1;
  ngx_str_node_t *pnVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  pnVar1 = (ngx_str_node_t *)rbtree->sentinel;
  do {
    pnVar2 = (ngx_str_node_t *)rbtree->root;
    if (pnVar2 == pnVar1) {
      return (ngx_str_node_t *)0x0;
    }
    uVar3 = (pnVar2->node).key;
    if (uVar3 == hash) {
      uVar3 = val->len;
      uVar4 = (pnVar2->str).len;
      bVar7 = uVar4 <= uVar3;
      if (uVar3 != uVar4) goto LAB_00117bc8;
      iVar5 = memcmp(val->data,(pnVar2->str).data,uVar3);
      lVar6 = 8;
      if ((-1 < iVar5) && (lVar6 = 0x10, iVar5 == 0)) {
        return pnVar2;
      }
    }
    else {
      bVar7 = uVar3 <= hash;
LAB_00117bc8:
      lVar6 = (ulong)bVar7 * 8 + 8;
    }
    rbtree = (ngx_rbtree_t *)((long)&(pnVar2->node).key + lVar6);
  } while( true );
}

Assistant:

ngx_str_node_t *
ngx_str_rbtree_lookup(ngx_rbtree_t *rbtree, ngx_str_t *val, uint32_t hash)
{
    ngx_int_t           rc;
    ngx_str_node_t     *n;
    ngx_rbtree_node_t  *node, *sentinel;

    node = rbtree->root;
    sentinel = rbtree->sentinel;

    while (node != sentinel) {

        n = (ngx_str_node_t *) node;

        if (hash != node->key) {
            node = (hash < node->key) ? node->left : node->right;
            continue;
        }

        if (val->len != n->str.len) {
            node = (val->len < n->str.len) ? node->left : node->right;
            continue;
        }

        rc = ngx_memcmp(val->data, n->str.data, val->len);

        if (rc < 0) {
            node = node->left;
            continue;
        }

        if (rc > 0) {
            node = node->right;
            continue;
        }

        return n;
    }

    return NULL;
}